

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O1

Nonnull<const_char_*>
absl::lts_20250127::log_internal::
MakeCheckOpString<std::__cxx11::string_const&,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2,
          Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  undefined1 local_190 [376];
  
  CheckOpMessageBuilder::CheckOpMessageBuilder((CheckOpMessageBuilder *)local_190,exprtext);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(v1->_M_dataplus)._M_p,v1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," vs. ",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(v2->_M_dataplus)._M_p,v2->_M_string_length);
  pcVar1 = CheckOpMessageBuilder::NewString((CheckOpMessageBuilder *)local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}